

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  uint uVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImU32 IVar8;
  ImGuiColumns *pIVar9;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  ImRect bb;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems == false) {
    uVar1 = (flags & 3U) - 1;
    if ((flags & 3U ^ uVar1) <= uVar1) {
      __assert_fail("ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0x4d1,"void ImGui::SeparatorEx(ImGuiSeparatorFlags)");
    }
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        fVar2 = (pIVar3->Pos).x;
        bb.Min.x = fVar2;
        if ((pIVar3->DC).GroupStack.Size != 0) {
          bb.Min.x = (pIVar3->DC).Indent.x + fVar2;
        }
        bb.Max.x = fVar2 + (pIVar3->Size).x;
        bVar6 = true;
        if (((flags & 4U) == 0) ||
           (pIVar9 = (pIVar3->DC).CurrentColumns, pIVar9 == (ImGuiColumns *)0x0)) {
          pIVar9 = (ImGuiColumns *)0x0;
        }
        else {
          local_50 = bb.Min.x;
          local_4c = bb.Max.x;
          PushColumnsBackground();
          bVar6 = false;
          bb.Max.x = local_4c;
          bb.Min.x = local_50;
        }
        bb.Min.y = (pIVar3->DC).CursorPos.y;
        bb.Max.y = bb.Min.y + 1.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ItemSize(&local_58,-1.0);
        bVar7 = ItemAdd(&bb,0,(ImRect *)0x0);
        if (bVar7) {
          pIVar4 = pIVar3->DrawList;
          local_58.y = bb.Min.y;
          local_58.x = bb.Max.x;
          IVar8 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar4,&bb.Min,&local_58,IVar8,1.0);
          if (pIVar5->LogEnabled == true) {
            LogRenderedText(&bb.Min,"--------------------------------",(char *)0x0);
          }
        }
        if (!bVar6) {
          PopColumnsBackground();
          pIVar9->LineMinY = (pIVar3->DC).CursorPos.y;
        }
      }
    }
    else {
      bb.Min.x = (pIVar3->DC).CursorPos.x;
      bb.Min.y = (pIVar3->DC).CursorPos.y;
      bb.Max.x = bb.Min.x + 1.0;
      bb.Max.y = (pIVar3->DC).CurrLineSize.y + bb.Min.y;
      local_58.x = 0.0;
      local_58.y = 0.0;
      ItemSize(&local_58,-1.0);
      bVar6 = ItemAdd(&bb,0,(ImRect *)0x0);
      if (bVar6) {
        pIVar4 = pIVar3->DrawList;
        local_58.y = bb.Min.y;
        local_58.x = bb.Min.x;
        local_38.x = bb.Min.x;
        local_38.y = bb.Max.y;
        IVar8 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar4,&local_58,&local_38,IVar8,1.0);
        if (pIVar5->LogEnabled == true) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}